

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::con_<256l,1l,1l,1,1,0,0>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (con_<256L,_1L,_1L,_1,_1,_0,_0> *this,
          subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  tensor_conv *this_00;
  long in_RDI;
  size_t in_stack_000000b8;
  tensor *in_stack_000000c0;
  alias_tensor *in_stack_000000c8;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined1 use_relu;
  tensor *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 uVar2;
  tensor *in_stack_fffffffffffffe58;
  resizable_tensor *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 uVar3;
  int in_stack_fffffffffffffe70;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
  dimpl::
  subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
  ::get_output((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
                *)0x1e47f4);
  alias_tensor::operator()(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  uVar1 = *(undefined4 *)(in_RDI + 0x174);
  tt::tensor_conv::setup
            ((tensor_conv *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (tensor *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe44,in_stack_fffffffffffffe70);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e4861);
  if ((*(byte *)(in_RDI + 0x178) & 1) == 0) {
    uVar3 = (undefined1)((ulong)(in_RDI + 0x128) >> 0x38);
    dimpl::
    subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
    ::get_output((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
                  *)0x1e49f1);
    uVar2 = 0;
    alias_tensor::operator()(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    tt::tensor_conv::operator()
              ((tensor_conv *)CONCAT44(uVar2,in_stack_fffffffffffffe50),(bool)uVar3,
               (resizable_tensor *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (tensor *)CONCAT44(in_stack_fffffffffffffe3c,uVar1),(tensor *)0x1e4a3c);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e4a4b);
  }
  else {
    this_00 = (tensor_conv *)(in_RDI + 0x128);
    dimpl::
    subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
    ::get_output((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
                  *)0x1e489d);
    use_relu = (undefined1)((uint)in_stack_fffffffffffffe44 >> 0x18);
    alias_tensor::operator()(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
    alias_tensor::operator()(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    tt::tensor_conv::operator()
              (this_00,(bool)uVar3,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (tensor *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48,(bool)use_relu);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e4946);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e4953);
  }
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            conv.setup(sub.get_output(),
                       filters(params,0),
                       _stride_y,
                       _stride_x,
                       padding_y_,
                       padding_x_);

            if (use_bias)
            {
                conv(false, output,
                     sub.get_output(),
                     filters(params,0),
                     biases(params, filters.size()),
                     use_relu);
            }
            else
            {
                conv(false, output,
                     sub.get_output(),
                     filters(params,0));
            }
        }